

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

int __thiscall capnp::DynamicList::Builder::init(Builder *this,EVP_PKEY_CTX *ctx)

{
  Builder value;
  ListBuilder builder;
  ListBuilder builder_00;
  Builder value_00;
  Builder value_01;
  ListSchema schema;
  ListSchema schema_00;
  Type TVar1;
  ElementSize elementSize;
  Which WVar2;
  uint uVar3;
  uint uVar4;
  uint in_ECX;
  uint in_EDX;
  Builder value_02;
  Fault local_1d0;
  Fault f_2;
  ListBuilder local_1b0;
  Type local_188;
  Builder local_178;
  Schema local_140;
  StructSize local_134;
  PointerBuilder local_130;
  ListBuilder local_118;
  Type local_f0;
  Builder local_e0;
  undefined1 local_a8 [8];
  ListSchema elementType;
  PointerBuilder local_70;
  Builder local_58;
  Fault local_40;
  Fault f_1;
  Fault local_28;
  Fault f;
  uint size_local;
  uint index_local;
  Builder *this_local;
  
  f.exception._0_4_ = in_ECX;
  f.exception._4_4_ = in_EDX;
  uVar3 = size((Builder *)ctx);
  if (uVar3 <= in_EDX) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4e0,FAILED,"index < this->size()","\"List index out-of-bounds.\"",
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  WVar2 = ListSchema::whichElementType((ListSchema *)ctx);
  switch(WVar2) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case ENUM:
  case STRUCT:
  case INTERFACE:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4f2,FAILED,(char *)0x0,"\"Expected a list or blob.\"",
               (char (*) [25])"Expected a list or blob.");
    kj::_::Debug::Fault::fatal(&local_40);
  case TEXT:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    capnp::_::ListBuilder::getPointerElement(&local_70,(ListBuilder *)(ctx + 0x10),uVar4);
    uVar4 = bounded<unsigned_int>((uint)f.exception);
    capnp::_::PointerBuilder::initBlob<capnp::Text>(&local_58,&local_70,uVar4);
    value.content.ptr = local_58.content.ptr;
    value._0_8_ = local_58._0_8_;
    value.content.size_ = local_58.content.size_;
    DynamicValue::Builder::Builder((Builder *)this,value);
    break;
  case DATA:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    capnp::_::ListBuilder::getPointerElement
              ((PointerBuilder *)&elementType.elementType.field_4,(ListBuilder *)(ctx + 0x10),uVar4)
    ;
    uVar4 = bounded<unsigned_int>((uint)f.exception);
    value_02 = capnp::_::PointerBuilder::initBlob<capnp::Data>
                         ((PointerBuilder *)&elementType.elementType.field_4,uVar4);
    DynamicValue::Builder::Builder((Builder *)this,value_02);
    break;
  case LIST:
    _local_a8 = (Type)ListSchema::getListElementType((ListSchema *)ctx);
    WVar2 = ListSchema::whichElementType((ListSchema *)local_a8);
    TVar1 = _local_a8;
    _local_a8 = TVar1;
    if (WVar2 == STRUCT) {
      local_f0.baseType = local_a8._0_2_;
      local_f0.listDepth = local_a8[2];
      local_f0.isImplicitParam = (bool)local_a8[3];
      local_f0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_a8._4_2_;
      local_f0._6_2_ = local_a8._6_2_;
      local_f0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)elementType.elementType._0_8_;
      uVar4 = bounded<unsigned_int>(f.exception._4_4_);
      capnp::_::ListBuilder::getPointerElement(&local_130,(ListBuilder *)(ctx + 0x10),uVar4);
      uVar4 = bounded<unsigned_int>((uint)f.exception);
      local_140.raw = (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)local_a8);
      local_134 = anon_unknown_70::structSizeFromSchema((StructSchema)local_140.raw);
      capnp::_::PointerBuilder::initStructList(&local_118,&local_130,uVar4,local_134);
      schema_00.elementType.field_4.schema = local_f0.field_4.schema;
      schema_00.elementType.baseType = local_f0.baseType;
      schema_00.elementType.listDepth = local_f0.listDepth;
      schema_00.elementType.isImplicitParam = local_f0.isImplicitParam;
      schema_00.elementType.field_3 = local_f0.field_3;
      schema_00.elementType._6_2_ = local_f0._6_2_;
      builder.capTable = local_118.capTable;
      builder.segment = local_118.segment;
      builder.ptr = local_118.ptr;
      builder.elementCount = local_118.elementCount;
      builder.step = local_118.step;
      builder.structDataSize = local_118.structDataSize;
      builder.structPointerCount = local_118.structPointerCount;
      builder.elementSize = local_118.elementSize;
      builder._39_1_ = local_118._39_1_;
      Builder(&local_e0,schema_00,builder);
      value_00.schema.elementType.field_4.schema = local_e0.schema.elementType.field_4.schema;
      value_00.schema.elementType.baseType = local_e0.schema.elementType.baseType;
      value_00.schema.elementType.listDepth = local_e0.schema.elementType.listDepth;
      value_00.schema.elementType.isImplicitParam = local_e0.schema.elementType.isImplicitParam;
      value_00.schema.elementType.field_3 = local_e0.schema.elementType.field_3;
      value_00.schema.elementType._6_2_ = local_e0.schema.elementType._6_2_;
      value_00.builder.segment = local_e0.builder.segment;
      value_00.builder.capTable = local_e0.builder.capTable;
      value_00.builder.ptr = local_e0.builder.ptr;
      value_00.builder.elementCount = local_e0.builder.elementCount;
      value_00.builder.step = local_e0.builder.step;
      value_00.builder.structDataSize = local_e0.builder.structDataSize;
      value_00.builder.structPointerCount = local_e0.builder.structPointerCount;
      value_00.builder.elementSize = local_e0.builder.elementSize;
      value_00.builder._39_1_ = local_e0.builder._39_1_;
      DynamicValue::Builder::Builder((Builder *)this,value_00);
    }
    else {
      local_188.baseType = local_a8._0_2_;
      local_188.listDepth = local_a8[2];
      local_188.isImplicitParam = (bool)local_a8[3];
      local_188.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_a8._4_2_;
      local_188._6_2_ = local_a8._6_2_;
      local_188.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)elementType.elementType._0_8_;
      uVar4 = bounded<unsigned_int>(f.exception._4_4_);
      capnp::_::ListBuilder::getPointerElement
                ((PointerBuilder *)&f_2,(ListBuilder *)(ctx + 0x10),uVar4);
      WVar2 = ListSchema::whichElementType((ListSchema *)local_a8);
      elementSize = anon_unknown_70::elementSizeFor(WVar2);
      uVar4 = bounded<unsigned_int>((uint)f.exception);
      capnp::_::PointerBuilder::initList(&local_1b0,(PointerBuilder *)&f_2,elementSize,uVar4);
      schema.elementType.field_4.schema = local_188.field_4.schema;
      schema.elementType.baseType = local_188.baseType;
      schema.elementType.listDepth = local_188.listDepth;
      schema.elementType.isImplicitParam = local_188.isImplicitParam;
      schema.elementType.field_3 = local_188.field_3;
      schema.elementType._6_2_ = local_188._6_2_;
      builder_00.capTable = local_1b0.capTable;
      builder_00.segment = local_1b0.segment;
      builder_00.ptr = local_1b0.ptr;
      builder_00.elementCount = local_1b0.elementCount;
      builder_00.step = local_1b0.step;
      builder_00.structDataSize = local_1b0.structDataSize;
      builder_00.structPointerCount = local_1b0.structPointerCount;
      builder_00.elementSize = local_1b0.elementSize;
      builder_00._39_1_ = local_1b0._39_1_;
      Builder(&local_178,schema,builder_00);
      value_01.schema.elementType.field_4.schema = local_178.schema.elementType.field_4.schema;
      value_01.schema.elementType.baseType = local_178.schema.elementType.baseType;
      value_01.schema.elementType.listDepth = local_178.schema.elementType.listDepth;
      value_01.schema.elementType.isImplicitParam = local_178.schema.elementType.isImplicitParam;
      value_01.schema.elementType.field_3 = local_178.schema.elementType.field_3;
      value_01.schema.elementType._6_2_ = local_178.schema.elementType._6_2_;
      value_01.builder.segment = local_178.builder.segment;
      value_01.builder.capTable = local_178.builder.capTable;
      value_01.builder.ptr = local_178.builder.ptr;
      value_01.builder.elementCount = local_178.builder.elementCount;
      value_01.builder.step = local_178.builder.step;
      value_01.builder.structDataSize = local_178.builder.structDataSize;
      value_01.builder.structPointerCount = local_178.builder.structPointerCount;
      value_01.builder.elementSize = local_178.builder.elementSize;
      value_01.builder._39_1_ = local_178.builder._39_1_;
      DynamicValue::Builder::Builder((Builder *)this,value_01);
    }
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x50e,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal(&local_1d0);
  default:
    DynamicValue::Builder::Builder((Builder *)this,(nullptr_t)0x0);
  }
  return (int)this;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::init(uint index, uint size) {
  KJ_REQUIRE(index < this->size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("Expected a list or blob.");
      return nullptr;

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Text>(bounded(size) * BYTES);

    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Data>(bounded(size) * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();

      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initStructList(bounded(size) * ELEMENTS,
                                   structSizeFromSchema(elementType.getStructElementType())));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initList(elementSizeFor(elementType.whichElementType()),
                             bounded(size) * ELEMENTS));
      }
    }

    case schema::Type::ANY_POINTER: {
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;
    }
  }

  return nullptr;
}